

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O0

pcre * __thiscall re2::PCRE::Compile(PCRE *this,Anchor anchor)

{
  char *pcVar1;
  string *this_00;
  ostream *poVar2;
  LogMessage local_1e8;
  undefined1 local_66;
  allocator local_65 [20];
  allocator local_51;
  string local_50 [8];
  string wrapped;
  pcre *local_30;
  pcre *re;
  char *pcStack_20;
  int eoffset;
  char *error;
  PCRE *pPStack_10;
  Anchor anchor_local;
  PCRE *this_local;
  
  pcStack_20 = "";
  error._4_4_ = anchor;
  pPStack_10 = this;
  if (anchor == ANCHOR_BOTH) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"(?:",&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    std::__cxx11::string::operator+=(local_50,(string *)this);
    std::__cxx11::string::operator+=(local_50,")\\z");
    pcVar1 = (char *)std::__cxx11::string::c_str();
    local_30 = pcre_compile(pcVar1,this->options_ & EnabledCompileOptions,&stack0xffffffffffffffe0,
                            (int *)((long)&re + 4),(uchar *)0x0);
    std::__cxx11::string::~string(local_50);
  }
  else {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    local_30 = pcre_compile(pcVar1,this->options_ & EnabledCompileOptions,&stack0xffffffffffffffe0,
                            (int *)((long)&re + 4),(uchar *)0x0);
  }
  if (local_30 == (pcre *)0x0) {
    if (this->error_ == (string *)empty_string_abi_cxx11_) {
      this_00 = (string *)operator_new(0x20);
      pcVar1 = pcStack_20;
      local_66 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(this_00,pcVar1,local_65);
      local_66 = 0;
      this->error_ = (string *)this_00;
      std::allocator<char>::~allocator((allocator<char> *)local_65);
    }
    LogMessage::LogMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc",0xac,
               2);
    poVar2 = LogMessage::stream(&local_1e8);
    poVar2 = std::operator<<(poVar2,"Error compiling \'");
    poVar2 = std::operator<<(poVar2,(string *)this);
    poVar2 = std::operator<<(poVar2,"\': ");
    std::operator<<(poVar2,pcStack_20);
    LogMessage::~LogMessage(&local_1e8);
  }
  return local_30;
}

Assistant:

pcre* PCRE::Compile(Anchor anchor) {
  // Special treatment for anchoring.  This is needed because at
  // runtime pcre only provides an option for anchoring at the
  // beginning of a string.
  //
  // There are three types of anchoring we want:
  //    UNANCHORED      Compile the original pattern, and use
  //                    a pcre unanchored match.
  //    ANCHOR_START    Compile the original pattern, and use
  //                    a pcre anchored match.
  //    ANCHOR_BOTH     Tack a "\z" to the end of the original pattern
  //                    and use a pcre anchored match.

  const char* error = "";
  int eoffset;
  pcre* re;
  if (anchor != ANCHOR_BOTH) {
    re = pcre_compile(pattern_.c_str(),
                      (options_ & EnabledCompileOptions),
                      &error, &eoffset, NULL);
  } else {
    // Tack a '\z' at the end of PCRE.  Parenthesize it first so that
    // the '\z' applies to all top-level alternatives in the regexp.
    string wrapped = "(?:";  // A non-counting grouping operator
    wrapped += pattern_;
    wrapped += ")\\z";
    re = pcre_compile(wrapped.c_str(),
                      (options_ & EnabledCompileOptions),
                      &error, &eoffset, NULL);
  }
  if (re == NULL) {
    if (error_ == &empty_string) error_ = new string(error);
    PCREPORT(ERROR) << "Error compiling '" << pattern_ << "': " << error;
  }
  return re;
}